

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O3

Bbl_Man_t * Bbl_ManReadBinaryBlif(char *pFileName)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  Bbl_Man_t *pBVar5;
  int *piVar6;
  Vec_Str_t *pVVar7;
  Vec_Str_t *pVVar8;
  Vec_Int_t *pVVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  char *pStr_1;
  char *pStr_2;
  char *pStr;
  
  pBVar5 = (Bbl_Man_t *)calloc(1,0x4d0);
  iVar4 = Bbl_ManFileSize(pFileName);
  pBVar5->nFileSize = iVar4;
  piVar6 = (int *)Bbl_ManFileRead(pFileName);
  pBVar5->pFileData = (char *)piVar6;
  pVVar7 = (Vec_Str_t *)calloc(1,0x10);
  lVar13 = (long)*piVar6;
  pVVar7->nSize = *piVar6;
  pVVar7->pArray = (char *)(piVar6 + 1);
  pBVar5->pName = pVVar7;
  pVVar7 = (Vec_Str_t *)calloc(1,0x10);
  iVar11 = *(int *)((long)piVar6 + lVar13 + 4);
  pVVar7->nSize = iVar11;
  pVVar7->pArray = (char *)((long)piVar6 + lVar13 + 8);
  pBVar5->pObjs = pVVar7;
  pVVar8 = (Vec_Str_t *)calloc(1,0x10);
  lVar3 = (long)iVar11 + lVar13 + 4;
  iVar1 = *(int *)((long)piVar6 + lVar3 + 4);
  pVVar8->nSize = iVar1;
  pVVar8->pArray = (char *)((long)piVar6 + lVar3 + 8);
  pBVar5->pFncs = pVVar8;
  if ((long)iVar1 + (long)iVar11 + lVar13 + 4 + 8 != (long)iVar4) {
    __assert_fail("pBuffer - p->pFileData == p->nFileSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/bbl/bblif.c"
                  ,0x2d7,"Bbl_Man_t *Bbl_ManReadBinaryBlif(char *)");
  }
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 1000;
  pVVar9->nSize = 0;
  piVar6 = (int *)malloc(4000);
  pVVar9->pArray = piVar6;
  pBVar5->vObj2Id = pVVar9;
  if (0 < iVar11) {
    iVar11 = 0;
    uVar10 = 0;
    do {
      pcVar2 = pVVar7->pArray;
      if (pcVar2 == (char *)0x0) {
        return pBVar5;
      }
      iVar1 = *(int *)(pcVar2 + uVar10);
      if (iVar11 == pVVar9->nCap) {
        if (iVar11 < 0x10) {
          if (piVar6 == (int *)0x0) {
            piVar6 = (int *)malloc(0x40);
          }
          else {
            piVar6 = (int *)realloc(piVar6,0x40);
          }
          pVVar9->pArray = piVar6;
          uVar12 = 0x10;
        }
        else {
          uVar12 = iVar11 * 2;
          if (piVar6 == (int *)0x0) {
            piVar6 = (int *)malloc((ulong)uVar12 * 4);
          }
          else {
            piVar6 = (int *)realloc(piVar6,(ulong)uVar12 * 4);
          }
          pVVar9->pArray = piVar6;
        }
        if (piVar6 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/bbl/bblif.c"
                        ,0x155,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar9->nCap = uVar12;
      }
      iVar11 = pVVar9->nSize;
      pVVar9->nSize = iVar11 + 1;
      piVar6[iVar11] = iVar1;
      iVar11 = pVVar9->nSize;
      *(int *)(pcVar2 + uVar10) = iVar11 + -1;
      uVar10 = uVar10 + 0xc + (*(uint *)(pcVar2 + (ulong)uVar10 + 8) >> 4) * 4;
    } while ((int)uVar10 < pVVar7->nSize);
  }
  return pBVar5;
}

Assistant:

Bbl_Man_t * Bbl_ManReadBinaryBlif( char * pFileName )
{
    Bbl_Man_t * p;
    Bbl_Obj_t * pObj;
    char * pBuffer;
    int h;
    p = BBLIF_ALLOC( Bbl_Man_t, 1 );
    memset( p, 0, sizeof(Bbl_Man_t) );
    p->nFileSize = Bbl_ManFileSize( pFileName );
    p->pFileData = Bbl_ManFileRead( pFileName );
    // extract three managers
    pBuffer = p->pFileData;
    p->pName = Vec_StrRead( &pBuffer );
    p->pObjs = Vec_StrRead( &pBuffer );
    p->pFncs = Vec_StrRead( &pBuffer );
    assert( pBuffer - p->pFileData == p->nFileSize );
    // remember original IDs in the objects
    p->vObj2Id = Vec_IntAlloc( 1000 );
    Bbl_ManForEachObj_int( p->pObjs, pObj, h )
    {
        Vec_IntPush( p->vObj2Id, pObj->Id );
        pObj->Id = Vec_IntSize(p->vObj2Id) - 1; 
    }
    return p;
}